

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O3

_Bool borg_think_home_buy_swap_armour(void)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  _Bool _Var6;
  wchar_t wVar7;
  borg_shop *pbVar8;
  angband_constants *paVar9;
  bool bVar10;
  ulong uVar11;
  int iVar12;
  int32_t iVar13;
  int iVar14;
  long lVar15;
  
  iVar4 = armour_swap_value;
  iVar3 = armour_swap;
  iVar2 = weapon_swap_value;
  iVar1 = weapon_swap;
  if (armour_swap_value < 1 || armour_swap < 1) {
    wVar7 = borg_first_empty_inventory_slot();
    armour_swap_value = -1;
    if (wVar7 == L'\xffffffff') {
      armour_swap_value = -1;
      return false;
    }
  }
  else {
    wVar7 = armour_swap + L'\xffffffff';
  }
  if (z_info->store_inven_max == 0) {
    _Var6 = false;
  }
  else {
    iVar12 = -1;
    lVar15 = 0;
    uVar11 = 0;
    bVar10 = false;
    pbVar8 = borg_shops;
    paVar9 = z_info;
    iVar13 = armour_swap_value;
    do {
      _Var6 = (pbVar8[7].ware)->curses[lVar15 + -0x26];
      if (_Var6 != false) {
        (pbVar8[7].ware)->curses[lVar15 + -0x26] = (_Bool)(_Var6 + -1);
        memcpy(borg_items + wVar7,(borg_safe_shops[7].ware)->desc + lVar15,0x388);
        borg_items[wVar7].iqty = '\x01';
        borg_notice(true);
        iVar5 = armour_swap_value;
        borg_items[wVar7].iqty = '\0';
        memcpy((borg_shops[7].ware)->desc + lVar15,(borg_safe_shops[7].ware)->desc + lVar15,0x388);
        iVar14 = iVar13;
        if (iVar13 < iVar5) {
          iVar14 = iVar5;
        }
        if (iVar13 < iVar5) {
          iVar12 = (int)uVar11;
        }
        bVar10 = true;
        pbVar8 = borg_shops;
        paVar9 = z_info;
        iVar13 = iVar14;
      }
      uVar11 = uVar11 + 1;
      lVar15 = lVar15 + 0x388;
    } while (uVar11 < paVar9->store_inven_max);
    if (bVar10) {
      borg_notice(true);
    }
    _Var6 = false;
    if ((-1 < iVar12) && (_Var6 = false, armour_swap_value < iVar13)) {
      borg.goal.shop = 7;
      borg.goal.ware = (int16_t)iVar12;
      _Var6 = true;
    }
  }
  weapon_swap = iVar1;
  weapon_swap_value = iVar2;
  armour_swap = iVar3;
  armour_swap_value = iVar4;
  return _Var6;
}

Assistant:

bool borg_think_home_buy_swap_armour(void)
{
    int hole;

    int     n, b_n = -1;
    int32_t p, b_p = 0L;
    bool    fix = false;
    int     old_weapon_swap;
    int32_t old_weapon_swap_value;
    int     old_armour_swap;
    int32_t old_armour_swap_value;

    /* save the current values */
    old_weapon_swap       = weapon_swap;
    old_weapon_swap_value = weapon_swap_value;
    old_armour_swap       = armour_swap;
    old_armour_swap_value = armour_swap_value;

    if (armour_swap <= 0 || armour_swap_value <= 0) {
        hole              = borg_first_empty_inventory_slot();
        armour_swap_value = -1L;
    } else {
        hole = armour_swap - 1;
    }

    if (hole == -1)
        return false;

    /* Extract the "power" */
    b_p = armour_swap_value;

    /* Scan the home */
    for (n = 0; n < z_info->store_inven_max; n++) {
        borg_item *item = &borg_shops[BORG_HOME].ware[n];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Remove one item from shop */
        borg_shops[BORG_HOME].ware[n].iqty--;

        /* Move new item into inventory */
        memcpy(&borg_items[hole], &borg_safe_shops[BORG_HOME].ware[n],
            sizeof(borg_item));

        /* Only a single item */
        borg_items[hole].iqty = 1;

        /* Fix later */
        fix = true;

        /* Examine the inventory (false)*/
        borg_notice(true);

        /* Evaluate the new equipment */
        p = armour_swap_value;

        /* Restore hole */
        borg_items[hole].iqty = 0;

        /* Restore shop item */
        memcpy(&borg_shops[BORG_HOME].ware[n],
            &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

        /* Ignore "silly" purchases */
        if (p <= b_p)
            continue;

        /* Save the item and value */
        b_n = n;
        b_p = p;
    }

    /* Examine the inventory */
    if (fix)
        borg_notice(true);

    /* Buy something */
    if ((b_n >= 0) && (b_p > armour_swap_value)) {
        /* Go to the home */
        borg.goal.shop = BORG_HOME;

        /* Buy that item */
        borg.goal.ware = b_n;

        /* Restore the values */
        weapon_swap       = old_weapon_swap;
        weapon_swap_value = old_weapon_swap_value;
        armour_swap       = old_armour_swap;
        armour_swap_value = old_armour_swap_value;

        /* Success */
        return true;
    }
    /* Restore the values */
    weapon_swap       = old_weapon_swap;
    weapon_swap_value = old_weapon_swap_value;
    armour_swap       = old_armour_swap;
    armour_swap_value = old_armour_swap_value;

    /* Nope */
    return false;
}